

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pooling.cpp
# Opt level: O2

void CoreMLConverter::convertCaffePooling(ConvertLayerParameters layerParameters)

{
  int iVar1;
  Rep *pRVar2;
  string *layerName;
  uint uVar3;
  Type *pTVar4;
  NeuralNetworkLayer *this;
  PoolingLayerParams *this_00;
  PoolingLayerParams_ValidCompletePadding *pPVar5;
  uint32 uVar6;
  void **ppvVar7;
  PoolingParameter *pPVar8;
  uint32 uVar9;
  long lVar10;
  long lVar11;
  allocator local_db;
  allocator local_da;
  allocator local_d9;
  string local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  string local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  string local_50;
  
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     (&((layerParameters.prototxt)->layer_).super_RepeatedPtrFieldBase,
                      *layerParameters.layerId);
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (layerParameters.nnWrite);
  if (((pTVar4->bottom_).super_RepeatedPtrFieldBase.current_size_ == 1) &&
     ((pTVar4->top_).super_RepeatedPtrFieldBase.current_size_ == 1)) {
    lVar11 = 1;
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_d8,"Must have 1 input and 1 output",(allocator *)&local_88);
    errorInCaffeProto(&local_d8,(pTVar4->name_).ptr_,(pTVar4->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_d8);
    lVar11 = (long)(pTVar4->bottom_).super_RepeatedPtrFieldBase.current_size_;
  }
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar2 = (pTVar4->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  for (lVar10 = 0; lVar11 * 8 != lVar10; lVar10 = lVar10 + 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&bottom,*(value_type **)((long)ppvVar7 + lVar10));
  }
  pRVar2 = (pTVar4->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  iVar1 = (pTVar4->top_).super_RepeatedPtrFieldBase.current_size_;
  for (lVar11 = 0; (long)iVar1 * 8 != lVar11; lVar11 = lVar11 + 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&top,*(value_type **)((long)ppvVar7 + lVar11));
  }
  convertCaffeMetadata
            ((pTVar4->name_).ptr_,&bottom,&top,layerParameters.nnWrite,
             layerParameters.mappingDataBlobNames);
  this_00 = CoreML::Specification::NeuralNetworkLayer::mutable_pooling(this);
  pPVar8 = pTVar4->pooling_param_;
  if (pPVar8 == (PoolingParameter *)0x0) {
    pPVar8 = (PoolingParameter *)&caffe::_PoolingParameter_default_instance_;
  }
  uVar3 = pPVar8->pool_;
  if (uVar3 == 2) {
    std::__cxx11::string::string((string *)&local_d8,"pool method",&local_d9);
    layerName = (pTVar4->name_).ptr_;
    std::__cxx11::string::string((string *)&local_88,"Pooling",&local_da);
    std::__cxx11::string::string((string *)&local_50,"Stochastic",&local_db);
    unsupportedCaffeParrameterWithOption(&local_d8,layerName,&local_88,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_d8);
    uVar3 = pPVar8->pool_;
  }
  if (uVar3 < 2) {
    this_00->type_ = uVar3;
  }
  if (pPVar8->global_pooling_ == true) {
    this_00->globalpooling_ = true;
  }
  if (((pPVar8->_has_bits_).has_bits_[0] & 4) == 0) {
    uVar9 = pPVar8->pad_h_;
    uVar6 = pPVar8->pad_w_;
  }
  else {
    uVar9 = pPVar8->pad_;
    uVar6 = uVar9;
  }
  pPVar5 = CoreML::Specification::PoolingLayerParams::mutable_includelastpixel(this_00);
  CoreML::Specification::PoolingLayerParams_ValidCompletePadding::add_paddingamounts
            (pPVar5,(ulong)uVar9);
  pPVar5 = CoreML::Specification::PoolingLayerParams::mutable_includelastpixel(this_00);
  CoreML::Specification::PoolingLayerParams_ValidCompletePadding::add_paddingamounts
            (pPVar5,(ulong)uVar6);
  if (((pPVar8->_has_bits_).has_bits_[0] & 0x800) == 0) {
    uVar9 = pPVar8->stride_h_;
    uVar6 = pPVar8->stride_w_;
  }
  else {
    uVar9 = pPVar8->stride_;
    uVar6 = uVar9;
  }
  CoreML::Specification::PoolingLayerParams::add_stride(this_00,(ulong)(uVar9 + (uVar9 == 0)));
  CoreML::Specification::PoolingLayerParams::add_stride(this_00,(ulong)(uVar6 + (uVar6 == 0)));
  if (((pPVar8->_has_bits_).has_bits_[0] & 2) == 0) {
    uVar9 = pPVar8->kernel_h_;
    uVar6 = pPVar8->kernel_w_;
  }
  else {
    uVar9 = pPVar8->kernel_size_;
    uVar6 = uVar9;
  }
  if ((uVar9 == 0 || uVar6 == 0) && (pPVar8->global_pooling_ == false)) {
    std::__cxx11::string::string
              ((string *)&local_d8,"Kernel size must be non-zero",(allocator *)&local_88);
    errorInCaffeProto(&local_d8,(pTVar4->name_).ptr_,(pTVar4->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  CoreML::Specification::PoolingLayerParams::add_kernelsize(this_00,(ulong)uVar9);
  CoreML::Specification::PoolingLayerParams::add_kernelsize(this_00,(ulong)uVar6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&top);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&bottom);
  return;
}

Assistant:

void CoreMLConverter::convertCaffePooling(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    Specification::PoolingLayerParams* specLayerParams = specLayer->mutable_pooling();
    const caffe::PoolingParameter& caffeLayerParams = caffeLayer.pooling_param();
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerParams.pool()==caffe::PoolingParameter::STOCHASTIC){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("pool method",caffeLayer.name(), "Pooling", "Stochastic");
    }
    //***************************************************************
    
    // Copy over the parameters.
    if (caffeLayerParams.pool() == caffe::PoolingParameter::MAX) {
        specLayerParams->set_type(Specification::PoolingLayerParams::MAX);
    } else if (caffeLayerParams.pool() == caffe::PoolingParameter::AVE) {
        specLayerParams->set_type(Specification::PoolingLayerParams::AVERAGE);
    }

    if (caffeLayerParams.global_pooling()) {
        specLayerParams->set_globalpooling(true);
    }

    uint32_t pad_h = 0;
    uint32_t pad_w = 0;
    if (caffeLayerParams.has_pad()){
        pad_h = caffeLayerParams.pad();
        pad_w = caffeLayerParams.pad();
    } else {
        pad_h = caffeLayerParams.pad_h();
        pad_w = caffeLayerParams.pad_w();
    }
    
    specLayerParams->mutable_includelastpixel()->add_paddingamounts(static_cast<uint64_t>(pad_h));
    specLayerParams->mutable_includelastpixel()->add_paddingamounts(static_cast<uint64_t>(pad_w));
    
    uint32_t stride_h = 0;
    uint32_t stride_w = 0;
    if (caffeLayerParams.has_stride()){
        stride_h = caffeLayerParams.stride();
        stride_w = caffeLayerParams.stride();
    } else {
        stride_h = caffeLayerParams.stride_h();
        stride_w = caffeLayerParams.stride_w();
    }
    if (stride_w == 0) {
        stride_w = 1;
    }
    if (stride_h == 0){
        stride_h = 1;
    }
    specLayerParams->add_stride(static_cast<uint64_t>(stride_h));
    specLayerParams->add_stride(static_cast<uint64_t>(stride_w));
    
    uint32_t kernel_h = 0;
    uint32_t kernel_w = 0;
    if (caffeLayerParams.has_kernel_size()){
        kernel_h = caffeLayerParams.kernel_size();
        kernel_w = caffeLayerParams.kernel_size();
    } else {
        kernel_h = caffeLayerParams.kernel_h();
        kernel_w = caffeLayerParams.kernel_w();
    }
    if((kernel_h == 0 || (kernel_w == 0)) && !(caffeLayerParams.global_pooling())){
        CoreMLConverter::errorInCaffeProto("Kernel size must be non-zero",caffeLayer.name(),caffeLayer.type());
    }
    
    specLayerParams->add_kernelsize(static_cast<uint64_t>(kernel_h));
    specLayerParams->add_kernelsize(static_cast<uint64_t>(kernel_w));
}